

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  _Alloc_hider _Var1;
  _Alloc_hider _Var2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  istream *piVar6;
  mapped_type *pmVar7;
  long lVar8;
  iterator iVar9;
  size_t *psVar10;
  pointer pcVar11;
  undefined1 local_b0 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  mime_types;
  string mime;
  int local_58;
  int types;
  int files;
  string type;
  
  std::istream::operator>>((istream *)&std::cin,(int *)(mime.field_2._M_local_buf + 0xc));
  std::istream::ignore();
  std::istream::operator>>((istream *)&std::cin,&local_58);
  std::istream::ignore();
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,mime.field_2._12_4_);
  poVar5 = std::operator<<(poVar5,", ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_58);
  std::endl<char,std::char_traits<char>>(poVar5);
  mime_types._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&mime_types;
  mime_types._M_t._M_impl._0_4_ = 0;
  mime_types._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  mime_types._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  mime_types._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  iVar3 = 0;
  mime_types._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       mime_types._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  while (psVar10 = &mime_types._M_t._M_impl.super__Rb_tree_header._M_node_count,
        iVar3 < (int)mime.field_2._12_4_) {
    _files = (pointer)&type._M_string_length;
    type._M_dataplus._M_p = (pointer)0x0;
    type._M_string_length._0_1_ = 0;
    mime_types._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)&mime._M_string_length;
    mime._M_dataplus._M_p = (pointer)0x0;
    mime._M_string_length._0_1_ = 0;
    types = iVar3;
    piVar6 = std::operator>>((istream *)&std::cin,(string *)&files);
    std::operator>>(piVar6,(string *)psVar10);
    std::istream::ignore();
    poVar5 = std::operator<<((ostream *)&std::cerr,"type: ");
    poVar5 = std::operator<<(poVar5,(string *)&files);
    poVar5 = std::operator<<(poVar5,", mime: ");
    poVar5 = std::operator<<(poVar5,(string *)psVar10);
    std::endl<char,std::char_traits<char>>(poVar5);
    _Var2 = type._M_dataplus;
    _Var1._M_p = _files;
    for (pcVar11 = (pointer)0x0; _Var2._M_p != pcVar11; pcVar11 = pcVar11 + 1) {
      iVar3 = tolower((int)_Var1._M_p[(long)pcVar11]);
      _Var1._M_p[(long)pcVar11] = (char)iVar3;
    }
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_b0,(key_type *)&files);
    std::__cxx11::string::_M_assign((string *)pmVar7);
    std::__cxx11::string::~string
              ((string *)&mime_types._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::__cxx11::string::~string((string *)&files);
    iVar3 = types + 1;
  }
  for (iVar3 = 0; iVar3 < local_58; iVar3 = iVar3 + 1) {
    _files = (pointer)&type._M_string_length;
    type._M_dataplus._M_p = (pointer)0x0;
    type._M_string_length._0_1_ = 0;
    std::operator>>((istream *)&std::cin,(string *)&files);
    std::istream::ignore();
    _Var2 = type._M_dataplus;
    _Var1._M_p = _files;
    for (pcVar11 = (pointer)0x0; _Var2._M_p != pcVar11; pcVar11 = pcVar11 + 1) {
      iVar4 = tolower((int)_Var1._M_p[(long)pcVar11]);
      _Var1._M_p[(long)pcVar11] = (char)iVar4;
    }
    lVar8 = std::__cxx11::string::rfind((char)(string *)&files,0x2e);
    poVar5 = std::operator<<((ostream *)&std::cerr,"file #");
    psVar10 = &mime_types._M_t._M_impl.super__Rb_tree_header._M_node_count;
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
    poVar5 = std::operator<<(poVar5,". ");
    poVar5 = std::operator<<(poVar5,(string *)&files);
    poVar5 = std::operator<<(poVar5,"; rpos = ");
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    poVar5 = std::operator<<(poVar5,", npos = ");
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::endl<char,std::char_traits<char>>(poVar5);
    if (lVar8 == -1) {
      poVar5 = std::operator<<((ostream *)&std::cout,"UNKNOWN");
      std::endl<char,std::char_traits<char>>(poVar5);
    }
    else {
      std::__cxx11::string::substr((ulong)psVar10,(ulong)&files);
      iVar9 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_b0,(key_type *)psVar10);
      if ((_Base_ptr)&mime_types == iVar9._M_node) {
        poVar5 = std::operator<<((ostream *)&std::cout,"UNKNOWN");
      }
      else {
        poVar5 = std::operator<<((ostream *)&std::cout,(string *)(iVar9._M_node + 2));
      }
      std::endl<char,std::char_traits<char>>(poVar5);
      std::__cxx11::string::~string((string *)psVar10);
    }
    std::__cxx11::string::~string((string *)&files);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_b0);
  return 0;
}

Assistant:

int main()
{
	int types, files;
	cin >> types; cin.ignore();
	cin >> files; cin.ignore();
	
	std::cerr << types << ", " << files << std::endl;
	
	std::map<std::string, std::string> mime_types;
	for (int i = 0; i < types; i++)
	{
	    std::string type;
	    std::string mime;
		std::cin >> type >> mime;
		std::cin.ignore();
		
		std::cerr << "type: " << type << ", mime: " << mime << std::endl;
		std::transform(type.begin(), type.end(), type.begin(), ::tolower);
		mime_types[type] = mime;
	}
	
	for (int i = 0; i < files; i++)
	{
	    std::string filename;
	    std::cin >> filename;
	    std::cin.ignore();
	    std::transform(filename.begin(), filename.end(), filename.begin(), ::tolower);
	    size_t pos = filename.rfind('.');
	    std::cerr << "file #" << i << ". " << filename << "; rpos = " << pos << ", npos = " << std::string::npos << std::endl;
	    
	    if (std::string::npos != pos)
	    {
	        std::string ext = filename.substr(pos + 1);
	        //std::cerr << pos << ", " << ext <<  std::endl;
	        std::map<std::string, std::string>::const_iterator i = mime_types.find(ext);
	        if (mime_types.end() == i)
	        {
	            std::cout << "UNKNOWN" << std::endl;
	        } else
	        {
	            std::cout << i->second << std::endl;
	        }
	    } else
	    {
	        std::cout << "UNKNOWN" << std::endl;
	    }
	}
	
	return 0;
}